

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::readLPF(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  long lVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar6;
  pointer pnVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  long *plVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  void *pvVar16;
  undefined7 extraout_var;
  type prVar17;
  undefined4 extraout_var_00;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_00;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_01;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_02;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_03;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_04;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *prVar18;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_05;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_06;
  undefined4 extraout_var_01;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_07;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_08;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_09;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_10;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_11;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_12;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_13;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_14;
  SPxOut *pSVar19;
  undefined8 *puVar20;
  ulong uVar21;
  ulong uVar22;
  int *piVar23;
  NameSet *pNVar24;
  long lVar25;
  byte *pbVar26;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar27;
  int iVar28;
  char *pcVar29;
  uint uVar30;
  undefined8 uVar31;
  undefined8 unaff_R12;
  byte *pbVar32;
  undefined7 uVar34;
  ulong uVar33;
  int iVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar39;
  long in_FS_OFFSET;
  char *pos;
  NameSet *cnames;
  char *tmp;
  char *line;
  char *buf;
  Rational val;
  NameSet *rnames;
  Rational pre_sign;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  vec;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  cset;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  row;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  rset;
  char name [8192];
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  emptycol;
  byte *local_25e8;
  char *local_25e0;
  byte *local_25d8;
  uint local_25cc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_25c8;
  int local_25c0;
  int local_25bc;
  undefined8 local_25b8;
  NameSet *local_25b0;
  byte *local_25a8;
  char *local_25a0;
  uint local_2594;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_2590;
  byte *local_2588;
  byte *local_2580;
  data_type local_2578;
  char local_2563;
  char local_2562;
  data_type local_2558;
  char local_2543;
  char local_2542;
  long local_2530;
  NameSet *local_2528;
  DIdxSet *local_2520;
  data_type local_2518;
  char local_2503;
  char local_2502;
  data_type local_24f8;
  char local_24e3;
  char local_24e2;
  istream *local_24d8;
  long local_24d0;
  long local_24c8;
  longlong local_24c0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_24b8;
  data_type local_2498;
  char local_2483;
  char local_2482;
  uint local_2478;
  void *local_2470;
  char local_2463;
  char local_2462;
  NameSet *local_2450;
  NameSet *local_2448;
  longdouble local_2440;
  longdouble local_2434;
  double local_2428;
  double local_2420;
  data_type local_2418;
  char local_2403;
  char local_2402;
  uint local_23f8;
  void *local_23f0;
  char local_23e3;
  char local_23e2;
  data_type local_23d8;
  char local_23c3;
  char local_23c2;
  uint local_23b8;
  void *local_23b0;
  char local_23a3;
  char local_23a2;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_2390;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_22c8;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_21e0;
  data_type local_2118;
  uint local_2108;
  undefined2 local_2104;
  char local_2102;
  data_type local_20f8;
  undefined4 local_20e8;
  undefined2 local_20e4;
  char local_20e2;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_118;
  
  local_25c8 = this;
  local_2520 = p_intvars;
  local_2448 = p_rnames;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase(&local_2390,-1,-1);
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowSetBase(&local_21e0,-1,-1);
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColBase(&local_118,0);
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowBase(&local_22c8,0);
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x0;
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memsize = 0;
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  local_24b8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a9f50;
  local_24b8.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocMem(&local_24b8,8);
  local_2118.la[0] = 1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_2578.ld,(longlong *)local_2118.la,(type *)0x0);
  local_2580 = (byte *)0x0;
  local_25a0 = (char *)0x0;
  local_2588 = (byte *)0x0;
  local_25e8 = (byte *)0x0;
  local_2450 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_25b0 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_25b0,1);
    p_cnames = local_25b0;
    NameSet::NameSet(local_25b0,10000,-1,2.0,2.0);
  }
  local_25b0 = p_cnames;
  NameSet::clear(p_cnames);
  pNVar24 = local_2448;
  if (local_2448 == (NameSet *)0x0) {
    local_2528 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_2528,1);
    pNVar24 = local_2528;
    NameSet::NameSet(local_2528,10000,-1,2.0,2.0);
  }
  local_2528 = pNVar24;
  NameSet::clear(pNVar24);
  clear(local_25c8);
  spx_alloc<char*>((char **)&local_2580,0x2000);
  spx_alloc<char*>(&local_25a0,0x2000);
  spx_alloc<char*>((char **)&local_2588,0x2000);
  local_2420 = *(double *)(in_FS_OFFSET + -8);
  local_2428 = -local_2420;
  local_2434 = (longdouble)local_2428;
  local_2440 = (longdouble)local_2420;
  local_24d0 = 0x2000;
  uVar22 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  local_2594 = 0x2001;
  local_25bc = 0;
  local_25c0 = 0;
  local_2590 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x0;
  local_25b8 = (byte *)((ulong)local_25b8._4_4_ << 0x20);
  local_24d8 = p_input;
LAB_001608a2:
  local_25cc = (uint)uVar22;
LAB_001608a9:
  local_24c8 = local_24d0;
  iVar35 = (int)local_24d0;
  local_2530 = 0;
  iVar28 = 0;
  while( true ) {
    pbVar26 = local_2580;
    std::ios::widen((char)p_input->_vptr_basic_istream[-3] + (char)p_input);
    local_24d0 = local_2530 + iVar35;
    plVar12 = (long *)std::istream::getline
                                ((char *)p_input,(long)(pbVar26 + iVar28),
                                 (char)local_24d0 - (char)iVar28);
    if ((*(byte *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x20) & 5) == 0) break;
    std::ios::clear((int)p_input->_vptr_basic_istream[-3] + (int)p_input);
    sVar13 = strlen((char *)local_2580);
    uVar30 = (uint)local_25b8;
    if ((local_2530 + iVar35) - 1U != sVar13) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ELPFRD07 No \'End\' marker found",0x1e);
      plVar12 = &std::cerr;
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
      std::ostream::put(-0x80);
      local_2590 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT71((int7)((ulong)plVar12 >> 8),1);
      std::ostream::flush();
      goto LAB_00160a20;
    }
    if (local_24d0 == 0x7fffdfff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ELPFRD16 Line longer than INT_MAX",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      goto LAB_00163885;
    }
    lVar36 = local_2530 + 0x2000;
    iVar28 = iVar35 + -1 + (int)local_2530;
    spx_realloc<char*>((char **)&local_2580,(int)local_24c8 + (int)local_2530 + 0x2000);
    p_input = local_24d8;
    local_2530 = lVar36;
  }
  uVar30 = (uint)local_25b8;
LAB_00160a20:
  pcVar15 = (char *)(ulong)uVar30;
  if (((ulong)local_2590 & 1) == 0) {
    uVar38 = (int)local_24c8 + (int)local_2530;
    if (8 < uVar38) {
      spx_realloc<char*>(&local_25a0,uVar38);
      spx_realloc<char*>((char **)&local_2588,uVar38);
    }
    local_25e8 = local_2580;
    local_25d8 = local_2580;
    pcVar14 = strchr((char *)local_2580,0x5c);
    if (pcVar14 != (char *)0x0) {
      *pcVar14 = '\0';
    }
    local_25bc = local_25bc + 1;
    pcVar14 = pcVar15;
    if (uVar30 == 0) {
      do {
        pbVar26 = local_25d8;
        uVar30 = (uint)pcVar15;
        cVar3 = "max[imize]"[(int)uVar30];
        lVar36 = (long)(int)pcVar14;
        if (cVar3 == '[') {
          pcVar2 = "max[imize]" + (int)(uVar30 + 1);
          lVar37 = 0;
          local_25e0 = pcVar14;
          do {
            pcVar29 = pcVar15;
            pcVar14 = pcVar2;
            bVar4 = pbVar26[lVar37 + lVar36];
            iVar35 = tolower((int)(char)bVar4);
            lVar25 = lVar37 + 1;
            if (bVar4 == 0) break;
            lVar1 = lVar37 + (long)(int)uVar30 + 1;
            pcVar2 = pcVar14 + 1;
            lVar37 = lVar25;
            pcVar15 = (char *)(ulong)((int)pcVar29 + 1);
          } while (iVar35 == "max[imize]"[lVar1]);
          do {
            uVar30 = (int)pcVar29 + 1;
            pcVar29 = (char *)(ulong)uVar30;
            cVar3 = *pcVar14;
            pcVar14 = pcVar14 + 1;
          } while (cVar3 != ']');
          pcVar14 = (char *)(ulong)(((int)local_25e0 + (int)lVar25) - 2);
        }
        else {
          if (cVar3 == '\0') goto LAB_00160ec8;
          iVar35 = tolower((int)(char)local_25d8[lVar36]);
          if (iVar35 != cVar3) goto LAB_00160deb;
        }
        pcVar15 = (char *)(ulong)(uVar30 + 1);
        pcVar14 = (char *)(ulong)((int)pcVar14 + 1);
      } while( true );
    }
    if (uVar30 == 1) {
      iVar35 = 0;
      pbVar26 = (byte *)0x0;
      do {
        pbVar32 = local_25d8;
        cVar3 = "s[ubject][   ]t[o]"[iVar35];
        iVar28 = (int)pbVar26;
        if (cVar3 == '[') {
          local_25e0 = "s[ubject][   ]t[o]" + (long)iVar35 + 1;
          pcVar15 = "s[ubject][   ]t[o]" + (iVar35 + 1);
          lVar36 = 0;
          iVar10 = iVar35;
          local_25b8 = pbVar26;
          do {
            iVar35 = iVar10;
            pcVar14 = pcVar15;
            bVar4 = pbVar32[lVar36 + iVar28];
            iVar11 = tolower((int)(char)bVar4);
            lVar37 = lVar36 + 1;
            if (bVar4 == 0) break;
            pcVar2 = local_25e0 + lVar36;
            pcVar15 = pcVar14 + 1;
            lVar36 = lVar37;
            iVar10 = iVar35 + 1;
          } while (iVar11 == *pcVar2);
          do {
            iVar35 = iVar35 + 1;
            cVar3 = *pcVar14;
            pcVar14 = pcVar14 + 1;
          } while (cVar3 != ']');
          pbVar26 = (byte *)(ulong)(((int)local_25b8 + (int)lVar37) - 2);
        }
        else {
          if (cVar3 == '\0') goto LAB_00160db1;
          iVar10 = tolower((int)(char)local_25d8[iVar28]);
          if (iVar10 != cVar3) goto LAB_00160ce9;
        }
        iVar35 = iVar35 + 1;
        pbVar26 = (byte *)(ulong)((int)pbVar26 + 1);
      } while( true );
    }
    if (uVar30 == 2) {
      iVar35 = 0;
      pbVar26 = (byte *)0x0;
      do {
        pbVar32 = local_25d8;
        cVar3 = "s[ubject][   ]t[o]"[iVar35];
        iVar28 = (int)pbVar26;
        if (cVar3 == '[') {
          local_25e0 = "s[ubject][   ]t[o]" + (long)iVar35 + 1;
          pcVar15 = "s[ubject][   ]t[o]" + (iVar35 + 1);
          lVar36 = 0;
          iVar10 = iVar35;
          local_25a8 = pbVar26;
          do {
            iVar35 = iVar10;
            pcVar14 = pcVar15;
            bVar4 = pbVar32[lVar36 + iVar28];
            iVar11 = tolower((int)(char)bVar4);
            lVar37 = lVar36 + 1;
            if (bVar4 == 0) break;
            pcVar2 = local_25e0 + lVar36;
            pcVar15 = pcVar14 + 1;
            lVar36 = lVar37;
            iVar10 = iVar35 + 1;
          } while (iVar11 == *pcVar2);
          do {
            iVar35 = iVar35 + 1;
            cVar3 = *pcVar14;
            pcVar14 = pcVar14 + 1;
          } while (cVar3 != ']');
          pbVar26 = (byte *)(ulong)(((int)local_25a8 + (int)lVar37) - 2);
        }
        else {
          if (cVar3 == '\0') goto LAB_00160fd6;
          iVar10 = tolower((int)(char)local_25d8[iVar28]);
          if (iVar10 != cVar3) goto LAB_00160f06;
        }
        iVar35 = iVar35 + 1;
        pbVar26 = (byte *)(ulong)((int)pbVar26 + 1);
      } while( true );
    }
    goto LAB_0016140d;
  }
  goto LAB_00163b4c;
LAB_00160deb:
  if (cVar3 != '\0') {
LAB_00160df4:
    iVar35 = 0;
    pbVar26 = (byte *)0x0;
    local_25b8 = local_25e8;
    pbVar32 = local_25e8;
    do {
      cVar3 = "min[imize]"[iVar35];
      iVar28 = (int)pbVar26;
      if (cVar3 == '[') {
        local_25e0 = "min[imize]" + (long)iVar35 + 1;
        pcVar15 = "min[imize]" + (iVar35 + 1);
        lVar36 = 0;
        local_25d8 = pbVar26;
        iVar10 = iVar35;
        do {
          iVar35 = iVar10;
          pcVar14 = pcVar15;
          bVar4 = pbVar32[lVar36 + iVar28];
          iVar11 = tolower((int)(char)bVar4);
          lVar37 = lVar36 + 1;
          if (bVar4 == 0) break;
          pcVar2 = local_25e0 + lVar36;
          pcVar15 = pcVar14 + 1;
          lVar36 = lVar37;
          iVar10 = iVar35 + 1;
        } while (iVar11 == *pcVar2);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar3 != ']');
        pbVar26 = (byte *)(ulong)(((int)local_25d8 + (int)lVar37) - 2);
        pbVar32 = local_25b8;
      }
      else {
        if (cVar3 == '\0') goto LAB_00161112;
        iVar10 = tolower((int)(char)pbVar32[iVar28]);
        if (iVar10 != cVar3) goto LAB_00161107;
      }
      iVar35 = iVar35 + 1;
      pbVar26 = (byte *)(ulong)((int)pbVar26 + 1);
    } while( true );
  }
LAB_00160ec8:
  pbVar26 = local_25d8 + lVar36;
  bVar4 = local_25d8[lVar36];
  uVar31 = 1;
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_00160df4;
LAB_0016113e:
  iVar35 = 1;
  local_25e8 = pbVar26;
  (*(local_25c8->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x45])(local_25c8,uVar31);
  goto LAB_00161985;
LAB_00161107:
  if (cVar3 == '\0') {
LAB_00161112:
    pbVar26 = pbVar32 + iVar28;
    bVar4 = pbVar32[iVar28];
    uVar31 = 0xffffffff;
    if ((((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
       ((byte)(bVar4 - 0x3c) < 3)) goto LAB_0016113e;
  }
  iVar35 = 0;
  goto LAB_00161985;
LAB_00160ce9:
  if (cVar3 != '\0') {
LAB_00160cf1:
    iVar35 = 0;
    pcVar15 = (char *)0x0;
    local_25d8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      lVar36 = (long)iVar35;
      cVar3 = "s[uch][    ]t[hat]"[lVar36];
      lVar37 = (long)(int)pcVar15;
      if (cVar3 == '[') {
        pcVar14 = "s[uch][    ]t[hat]" + (iVar35 + 1);
        lVar25 = 0;
        iVar28 = iVar35;
        local_25e0 = pcVar15;
        do {
          iVar35 = iVar28;
          pcVar15 = pcVar14;
          bVar4 = pbVar26[lVar25 + lVar37];
          iVar10 = tolower((int)(char)bVar4);
          lVar1 = lVar25 + 1;
          if (bVar4 == 0) break;
          lVar5 = lVar25 + lVar36 + 1;
          pcVar14 = pcVar15 + 1;
          lVar25 = lVar1;
          iVar28 = iVar35 + 1;
        } while (iVar10 == "s[uch][    ]t[hat]"[lVar5]);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar15;
          pcVar15 = pcVar15 + 1;
        } while (cVar3 != ']');
        pcVar15 = (char *)(ulong)(((int)local_25e0 + (int)lVar1) - 2);
        pbVar26 = local_25d8;
      }
      else {
        if (cVar3 == '\0') goto LAB_001610d9;
        iVar28 = tolower((int)(char)pbVar26[lVar37]);
        if (iVar28 != cVar3) goto LAB_00161010;
      }
      iVar35 = iVar35 + 1;
      pcVar15 = (char *)(ulong)((int)pcVar15 + 1);
    } while( true );
  }
LAB_00160db1:
  bVar4 = local_25d8[iVar28];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_00160cf1;
  local_25e8 = local_25d8 + iVar28;
  goto LAB_00161375;
LAB_00161010:
  if (cVar3 != '\0') {
LAB_00161019:
    iVar35 = 0;
    pcVar15 = (char *)0x0;
    local_25d8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      lVar36 = (long)iVar35;
      cVar3 = "s[.][    ]t[.]"[lVar36];
      lVar37 = (long)(int)pcVar15;
      if (cVar3 == '[') {
        pcVar14 = "s[.][    ]t[.]" + (iVar35 + 1);
        lVar25 = 0;
        iVar28 = iVar35;
        local_25e0 = pcVar15;
        do {
          iVar35 = iVar28;
          pcVar15 = pcVar14;
          bVar4 = pbVar26[lVar25 + lVar37];
          iVar10 = tolower((int)(char)bVar4);
          lVar1 = lVar25 + 1;
          if (bVar4 == 0) break;
          lVar5 = lVar25 + lVar36 + 1;
          pcVar14 = pcVar15 + 1;
          lVar25 = lVar1;
          iVar28 = iVar35 + 1;
        } while (iVar10 == "s[.][    ]t[.]"[lVar5]);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar15;
          pcVar15 = pcVar15 + 1;
        } while (cVar3 != ']');
        pcVar15 = (char *)(ulong)(((int)local_25e0 + (int)lVar1) - 2);
        pbVar26 = local_25d8;
      }
      else {
        if (cVar3 == '\0') goto LAB_0016134a;
        iVar28 = tolower((int)(char)pbVar26[lVar37]);
        if (iVar28 != cVar3) goto LAB_00161279;
      }
      iVar35 = iVar35 + 1;
      pcVar15 = (char *)(ulong)((int)pcVar15 + 1);
    } while( true );
  }
LAB_001610d9:
  bVar4 = pbVar26[lVar37];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_00161019;
  goto LAB_0016136d;
LAB_00161279:
  if (cVar3 != '\0') {
LAB_00161282:
    iVar35 = 0;
    pbVar32 = (byte *)0x0;
    local_25b8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      cVar3 = "lazy con[straints]"[iVar35];
      lVar36 = (long)(int)pbVar32;
      if (cVar3 == '[') {
        local_25e0 = "lazy con[straints]" + (long)iVar35 + 1;
        pcVar15 = "lazy con[straints]" + (iVar35 + 1);
        lVar37 = 0;
        iVar28 = iVar35;
        local_25d8 = pbVar32;
        do {
          iVar35 = iVar28;
          pcVar14 = pcVar15;
          bVar4 = pbVar26[lVar37 + lVar36];
          iVar10 = tolower((int)(char)bVar4);
          lVar25 = lVar37 + 1;
          if (bVar4 == 0) break;
          pcVar2 = local_25e0 + lVar37;
          pcVar15 = pcVar14 + 1;
          lVar37 = lVar25;
          iVar28 = iVar35 + 1;
        } while (iVar10 == *pcVar2);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar3 != ']');
        pbVar32 = (byte *)(ulong)(((int)local_25d8 + (int)lVar25) - 2);
        pbVar26 = local_25b8;
      }
      else {
        if (cVar3 == '\0') goto LAB_00161b84;
        iVar28 = tolower((int)(char)pbVar26[lVar36]);
        if (iVar28 != cVar3) goto LAB_00161b77;
      }
      iVar35 = iVar35 + 1;
      pbVar32 = (byte *)(ulong)((int)pbVar32 + 1);
    } while( true );
  }
LAB_0016134a:
  bVar4 = pbVar26[lVar37];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_00161282;
LAB_0016136d:
  local_25e8 = pbVar26 + lVar37;
  goto LAB_00161375;
LAB_00161b77:
  iVar35 = 1;
  if (cVar3 != '\0') goto LAB_00161985;
LAB_00161b84:
  bVar4 = pbVar26[lVar36];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (iVar35 = 1, 2 < (byte)(bVar4 - 0x3c))) goto LAB_00161985;
  local_25e8 = pbVar26 + lVar36;
LAB_00161375:
  lVar36 = (long)local_24b8.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .memused + 1;
  lVar37 = (long)local_24b8.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .memused * 0x50;
  while( true ) {
    pNVar6 = local_24b8.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .m_elem;
    if (lVar36 + -1 == 0 || lVar36 < 1) break;
    pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(local_2390.object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)((long)&local_24b8.
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 .m_elem[-1].idx + lVar37));
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&local_24b8.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                .m_elem[-1].val.m_backend.m_value.num.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_data + lVar37));
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar39 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)((long)&pNVar6[-1].val.m_backend.m_value.den.m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + lVar37));
    lVar36 = lVar36 + -1;
    lVar37 = lVar37 + -0x50;
  }
  local_24b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ._8_8_ = local_24b8.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ._8_8_ & 0xffffffff;
  local_2118.la[0] = 1;
  prVar17 = boost::
            rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                         *)&local_2578.ld,(longlong *)local_2118.la);
  goto LAB_00161735;
LAB_00160f06:
  if (cVar3 != '\0') {
LAB_00160f0e:
    iVar35 = 0;
    pbVar32 = (byte *)0x0;
    local_25a8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      cVar3 = "s[uch][    ]t[hat]"[iVar35];
      iVar28 = (int)pbVar32;
      if (cVar3 == '[') {
        local_25e0 = "s[uch][    ]t[hat]" + (long)iVar35 + 1;
        pcVar15 = "s[uch][    ]t[hat]" + (iVar35 + 1);
        lVar36 = 0;
        iVar10 = iVar35;
        local_25d8 = pbVar32;
        do {
          iVar35 = iVar10;
          pcVar14 = pcVar15;
          bVar4 = pbVar26[lVar36 + iVar28];
          iVar11 = tolower((int)(char)bVar4);
          lVar37 = lVar36 + 1;
          if (bVar4 == 0) break;
          pcVar2 = local_25e0 + lVar36;
          pcVar15 = pcVar14 + 1;
          lVar36 = lVar37;
          iVar10 = iVar35 + 1;
        } while (iVar11 == *pcVar2);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar3 != ']');
        pbVar32 = (byte *)(ulong)(((int)local_25d8 + (int)lVar37) - 2);
        pbVar26 = local_25a8;
      }
      else {
        if (cVar3 == '\0') goto LAB_00161230;
        iVar10 = tolower((int)(char)pbVar26[iVar28]);
        if (iVar10 != cVar3) goto LAB_00161163;
      }
      iVar35 = iVar35 + 1;
      pbVar32 = (byte *)(ulong)((int)pbVar32 + 1);
    } while( true );
  }
LAB_00160fd6:
  bVar4 = local_25d8[iVar28];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_00160f0e;
  local_25e8 = local_25d8 + iVar28;
  goto LAB_00161711;
LAB_00161163:
  if (cVar3 != '\0') {
LAB_0016116b:
    iVar35 = 0;
    pcVar15 = (char *)0x0;
    local_25d8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      lVar36 = (long)iVar35;
      cVar3 = "s[.][    ]t[.]"[lVar36];
      lVar37 = (long)(int)pcVar15;
      if (cVar3 == '[') {
        pcVar14 = "s[.][    ]t[.]" + (iVar35 + 1);
        lVar25 = 0;
        iVar28 = iVar35;
        local_25e0 = pcVar15;
        do {
          iVar35 = iVar28;
          pcVar15 = pcVar14;
          bVar4 = pbVar26[lVar25 + lVar37];
          iVar10 = tolower((int)(char)bVar4);
          lVar1 = lVar25 + 1;
          if (bVar4 == 0) break;
          lVar5 = lVar25 + lVar36 + 1;
          pcVar14 = pcVar15 + 1;
          lVar25 = lVar1;
          iVar28 = iVar35 + 1;
        } while (iVar10 == "s[.][    ]t[.]"[lVar5]);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar15;
          pcVar15 = pcVar15 + 1;
        } while (cVar3 != ']');
        pcVar15 = (char *)(ulong)(((int)local_25e0 + (int)lVar1) - 2);
        pbVar26 = local_25d8;
      }
      else {
        if (cVar3 == '\0') goto LAB_001616e6;
        iVar28 = tolower((int)(char)pbVar26[lVar37]);
        if (iVar28 != cVar3) goto LAB_00161404;
      }
      iVar35 = iVar35 + 1;
      pcVar15 = (char *)(ulong)((int)pcVar15 + 1);
    } while( true );
  }
LAB_00161230:
  bVar4 = pbVar26[iVar28];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_0016116b;
  local_25e8 = pbVar26 + iVar28;
  goto LAB_00161711;
LAB_00161404:
  if (cVar3 != '\0') {
LAB_0016140d:
    iVar35 = 0;
    pcVar15 = (char *)0x0;
    local_25d8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      lVar36 = (long)iVar35;
      cVar3 = "lazy con[straints]"[lVar36];
      lVar37 = (long)(int)pcVar15;
      if (cVar3 == '[') {
        pcVar14 = "lazy con[straints]" + (iVar35 + 1);
        lVar25 = 0;
        iVar28 = iVar35;
        local_25e0 = pcVar15;
        do {
          iVar35 = iVar28;
          pcVar15 = pcVar14;
          bVar4 = pbVar26[lVar25 + lVar37];
          iVar10 = tolower((int)(char)bVar4);
          lVar1 = lVar25 + 1;
          if (bVar4 == 0) break;
          lVar5 = lVar25 + lVar36 + 1;
          pcVar14 = pcVar15 + 1;
          lVar25 = lVar1;
          iVar28 = iVar35 + 1;
        } while (iVar10 == "lazy con[straints]"[lVar5]);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar15;
          pcVar15 = pcVar15 + 1;
        } while (cVar3 != ']');
        pcVar15 = (char *)(ulong)(((int)local_25e0 + (int)lVar1) - 2);
        pbVar26 = local_25d8;
      }
      else {
        if (cVar3 == '\0') goto LAB_00161596;
        iVar28 = tolower((int)(char)pbVar26[lVar37]);
        if (iVar28 != cVar3) goto LAB_001614c5;
      }
      iVar35 = iVar35 + 1;
      pcVar15 = (char *)(ulong)((int)pcVar15 + 1);
    } while( true );
  }
LAB_001616e6:
  bVar4 = pbVar26[lVar37];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_0016140d;
  local_25e8 = pbVar26 + lVar37;
LAB_00161711:
  local_2118.la[0] = 1;
  prVar17 = boost::
            rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                         *)&local_2578.ld,(longlong *)local_2118.la);
LAB_00161735:
  iVar35 = 2;
LAB_0016173a:
  local_25cc = (uint)CONCAT71((int7)((ulong)prVar17 >> 8),1);
  goto LAB_00161985;
LAB_001614c5:
  if (cVar3 != '\0') {
LAB_001614ce:
    iVar35 = 0;
    pbVar32 = (byte *)0x0;
    local_25a8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      cVar3 = "bound[s]"[iVar35];
      iVar28 = (int)pbVar32;
      if (cVar3 == '[') {
        local_25e0 = "bound[s]" + (long)iVar35 + 1;
        pcVar15 = "bound[s]" + (iVar35 + 1);
        lVar36 = 0;
        iVar10 = iVar35;
        local_25d8 = pbVar32;
        do {
          iVar35 = iVar10;
          pcVar14 = pcVar15;
          bVar4 = pbVar26[lVar36 + iVar28];
          iVar11 = tolower((int)(char)bVar4);
          lVar37 = lVar36 + 1;
          if (bVar4 == 0) break;
          pcVar2 = local_25e0 + lVar36;
          pcVar15 = pcVar14 + 1;
          lVar36 = lVar37;
          iVar10 = iVar35 + 1;
        } while (iVar11 == *pcVar2);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar3 != ']');
        pbVar32 = (byte *)(ulong)(((int)local_25d8 + (int)lVar37) - 2);
        pbVar26 = local_25a8;
      }
      else {
        if (cVar3 == '\0') goto LAB_001616a2;
        iVar10 = tolower((int)(char)pbVar26[iVar28]);
        if (iVar10 != cVar3) goto LAB_001615d2;
      }
      iVar35 = iVar35 + 1;
      pbVar32 = (byte *)(ulong)((int)pbVar32 + 1);
    } while( true );
  }
LAB_00161596:
  bVar4 = pbVar26[lVar37];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_001614ce;
  local_25e8 = pbVar26 + lVar37;
LAB_001615c9:
  iVar35 = (uint)local_25b8;
  goto LAB_00161985;
LAB_001615d2:
  if (cVar3 == '\0') {
LAB_001616a2:
    bVar4 = pbVar26[iVar28];
    if ((((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
       ((byte)(bVar4 - 0x3c) < 3)) {
      local_25e8 = pbVar26 + iVar28;
      iVar35 = 3;
      goto LAB_00161985;
    }
  }
  iVar35 = 0;
  pbVar32 = (byte *)0x0;
  local_25a8 = local_25e8;
  pbVar26 = local_25e8;
  do {
    cVar3 = "bin[ary]"[iVar35];
    iVar28 = (int)pbVar32;
    if (cVar3 == '[') {
      local_25e0 = "bin[ary]" + (long)iVar35 + 1;
      pcVar15 = "bin[ary]" + (iVar35 + 1);
      lVar36 = 0;
      iVar10 = iVar35;
      local_25d8 = pbVar32;
      do {
        iVar35 = iVar10;
        pcVar14 = pcVar15;
        bVar4 = pbVar26[lVar36 + iVar28];
        iVar11 = tolower((int)(char)bVar4);
        lVar37 = lVar36 + 1;
        if (bVar4 == 0) break;
        pcVar2 = local_25e0 + lVar36;
        pcVar15 = pcVar14 + 1;
        lVar36 = lVar37;
        iVar10 = iVar35 + 1;
      } while (iVar11 == *pcVar2);
      do {
        iVar35 = iVar35 + 1;
        cVar3 = *pcVar14;
        pcVar14 = pcVar14 + 1;
      } while (cVar3 != ']');
      pbVar32 = (byte *)(ulong)(((int)local_25d8 + (int)lVar37) - 2);
      pbVar26 = local_25a8;
    }
    else {
      if (cVar3 == '\0') goto LAB_00161815;
      iVar10 = tolower((int)(char)pbVar26[iVar28]);
      if (iVar10 != cVar3) break;
    }
    iVar35 = iVar35 + 1;
    pbVar32 = (byte *)(ulong)((int)pbVar32 + 1);
  } while( true );
  if (cVar3 != '\0') {
LAB_0016174d:
    iVar35 = 0;
    pbVar32 = (byte *)0x0;
    local_25a8 = local_25e8;
    pbVar26 = local_25e8;
    do {
      cVar3 = "bin[aries]"[iVar35];
      lVar36 = (long)(int)pbVar32;
      if (cVar3 == '[') {
        local_25e0 = "bin[aries]" + (long)iVar35 + 1;
        pcVar15 = "bin[aries]" + (iVar35 + 1);
        lVar37 = 0;
        iVar28 = iVar35;
        local_25d8 = pbVar32;
        do {
          iVar35 = iVar28;
          pcVar14 = pcVar15;
          bVar4 = pbVar26[lVar37 + lVar36];
          iVar10 = tolower((int)(char)bVar4);
          lVar25 = lVar37 + 1;
          if (bVar4 == 0) break;
          pcVar2 = local_25e0 + lVar37;
          pcVar15 = pcVar14 + 1;
          lVar37 = lVar25;
          iVar28 = iVar35 + 1;
        } while (iVar10 == *pcVar2);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar3 != ']');
        pbVar32 = (byte *)(ulong)(((int)local_25d8 + (int)lVar25) - 2);
        pbVar26 = local_25a8;
      }
      else {
        if (cVar3 == '\0') goto LAB_0016194d;
        iVar28 = tolower((int)(char)pbVar26[lVar36]);
        if (iVar28 != cVar3) goto LAB_00161874;
      }
      iVar35 = iVar35 + 1;
      pbVar32 = (byte *)(ulong)((int)pbVar32 + 1);
    } while( true );
  }
LAB_00161815:
  bVar4 = pbVar26[iVar28];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_0016174d;
  local_25e8 = pbVar26 + iVar28;
  goto LAB_00161978;
LAB_00161874:
  if (cVar3 != '\0') {
LAB_0016187c:
    iVar35 = 0;
    local_25d8 = local_25e8;
    pbVar26 = (byte *)0x0;
    do {
      pbVar32 = local_25d8;
      cVar3 = "gen[erals]"[iVar35];
      iVar28 = (int)pbVar26;
      if (cVar3 == '[') {
        local_25e0 = "gen[erals]" + (long)iVar35 + 1;
        pcVar15 = "gen[erals]" + (iVar35 + 1);
        lVar36 = 0;
        iVar10 = iVar35;
        local_25a8 = pbVar26;
        do {
          iVar35 = iVar10;
          pcVar14 = pcVar15;
          bVar4 = pbVar32[lVar36 + iVar28];
          iVar11 = tolower((int)(char)bVar4);
          lVar37 = lVar36 + 1;
          if (bVar4 == 0) break;
          pcVar2 = local_25e0 + lVar36;
          pcVar15 = pcVar14 + 1;
          lVar36 = lVar37;
          iVar10 = iVar35 + 1;
        } while (iVar11 == *pcVar2);
        do {
          iVar35 = iVar35 + 1;
          cVar3 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (cVar3 != ']');
        pbVar26 = (byte *)(ulong)(((int)local_25a8 + (int)lVar37) - 2);
      }
      else {
        if (cVar3 == '\0') goto LAB_00161caf;
        iVar10 = tolower((int)(char)local_25d8[iVar28]);
        if (iVar10 != cVar3) goto LAB_00161be9;
      }
      iVar35 = iVar35 + 1;
      pbVar26 = (byte *)(ulong)((int)pbVar26 + 1);
    } while( true );
  }
LAB_0016194d:
  bVar4 = pbVar26[lVar36];
  if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
     (2 < (byte)(bVar4 - 0x3c))) goto LAB_0016187c;
  local_25e8 = pbVar26 + lVar36;
LAB_00161978:
  iVar35 = 5;
LAB_00161985:
  pNVar24 = local_2528;
  pbVar26 = local_25e8;
  if (iVar35 == 2) {
    pcVar15 = strchr((char *)local_25e8,0x3a);
    if (pcVar15 != (char *)0x0) {
      iVar28 = (int)((long)pcVar15 - (long)pbVar26);
      uVar30 = ~(uint)pbVar26 + (int)pcVar15;
      uVar22 = (long)pcVar15 - (long)pbVar26 & 0xffffffff;
      do {
        if ((int)uVar22 < 1) {
          local_25e8 = pbVar26 + (iVar28 + 1);
          goto LAB_00161ab9;
        }
        uVar21 = (ulong)uVar30;
        uVar33 = uVar22 - 1;
        uVar30 = uVar30 - 1;
        lVar36 = uVar22 - 1;
        uVar22 = uVar33;
      } while (pbVar26[lVar36] == 0x20);
      if (uVar33 == 0) {
        iVar10 = -1;
      }
      else {
        do {
          iVar10 = (int)uVar21;
          uVar21 = (ulong)(iVar10 - 1U);
          if (pbVar26[uVar21] == 0x20) {
            iVar10 = iVar10 + -1;
            goto LAB_00161a62;
          }
        } while (0 < (int)(iVar10 - 1U));
        iVar10 = iVar10 + -2;
      }
LAB_00161a62:
      if (iVar10 < (int)uVar33) {
        uVar22 = 0;
        do {
          *(byte *)((long)&local_2118 + uVar22) = pbVar26[iVar10 + (int)uVar22 + 1];
          uVar22 = uVar22 + 1;
        } while (iVar10 + (int)uVar22 < (int)uVar33);
        uVar22 = uVar22 & 0xffffffff;
      }
      else {
        uVar22 = 0;
      }
      *(undefined1 *)((long)&local_2118 + uVar22) = 0;
      if (pNVar24 != (NameSet *)0x0) {
        NameSet::add(pNVar24,(char *)local_2118.la);
      }
      local_25e8 = pbVar26 + (iVar28 + 1);
      local_2594 = 0;
    }
  }
  else if ((iVar35 == 1) && (pcVar15 = strchr((char *)local_25e8,0x3a), pcVar15 != (char *)0x0)) {
    uVar22 = (long)pcVar15 - (long)pbVar26 & 0xffffffff;
    do {
      if ((int)uVar22 < 1) break;
      lVar36 = uVar22 - 1;
      uVar22 = uVar22 - 1;
    } while (pbVar26[lVar36] == 0x20);
    local_25e8 = pbVar26 + (((long)pcVar15 - (long)pbVar26 << 0x20) + 0x100000000 >> 0x20);
  }
LAB_00161ab9:
  lVar37 = 1;
  lVar36 = 0;
  while (((ulong)local_25e8[lVar36] < 0x21 &&
         ((0x100002600U >> ((ulong)local_25e8[lVar36] & 0x3f) & 1) != 0))) {
    lVar36 = lVar36 + 1;
    lVar37 = lVar37 + 1;
  }
  local_25b8 = (byte *)CONCAT44(local_25b8._4_4_,iVar35);
  pbVar26 = local_25e8 + lVar37;
  iVar35 = 0;
LAB_00161af3:
  bVar4 = pbVar26[-1];
  uVar22 = (ulong)bVar4;
  if (uVar22 < 0x21) {
    if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
      if (uVar22 != 0) goto LAB_00161b3c;
      local_25a0[iVar35] = '\0';
      p_input = local_24d8;
      if (*local_25a0 != '\0') goto LAB_00161d15;
      goto LAB_001608a9;
    }
    bVar9 = *pbVar26;
    if ((bVar9 != 0) &&
       (((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a ||
        (pvVar16 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar9,0x15), pvVar16 != (void *)0x0)))
       ) goto LAB_00161b3c;
  }
  else {
LAB_00161b3c:
    lVar36 = (long)iVar35;
    iVar35 = iVar35 + 1;
    local_25a0[lVar36] = bVar4;
  }
  pbVar26 = pbVar26 + 1;
  goto LAB_00161af3;
LAB_00161be9:
  if (cVar3 == '\0') {
LAB_00161caf:
    bVar4 = local_25d8[iVar28];
    if (((0x20 < (ulong)bVar4) || ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
       (2 < (byte)(bVar4 - 0x3c))) goto LAB_00161bf8;
    local_25e8 = local_25d8 + iVar28;
LAB_00161cdc:
    iVar35 = 4;
    goto LAB_00161985;
  }
LAB_00161bf8:
  bVar8 = LPFhasKeyword((char **)&local_25e8,"int[egers]");
  if (bVar8) goto LAB_00161cdc;
  bVar8 = LPFhasKeyword((char **)&local_25e8,"end");
  if (bVar8) {
    local_2590 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT71(extraout_var,1);
LAB_00163b4c:
    (*(local_25c8->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0xd])(local_25c8,&local_2390,0);
    (*(local_25c8->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[8])(local_25c8,&local_21e0,0);
    goto LAB_00163885;
  }
  bVar8 = LPFhasKeyword((char **)&local_25e8,"s[ubject][   ]t[o]");
  if (((!bVar8) && (bVar8 = LPFhasKeyword((char **)&local_25e8,"s[uch][    ]t[hat]"), !bVar8)) &&
     ((bVar8 = LPFhasKeyword((char **)&local_25e8,"s[.][    ]t[.]"), !bVar8 &&
      (bVar8 = LPFhasKeyword((char **)&local_25e8,"lazy con[straints]"), !bVar8))))
  goto LAB_001615c9;
  if ((local_25cc & 1) != 0) goto LAB_00163885;
  local_2118.la[0] = 1;
  prVar17 = boost::
            rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                         *)&local_2578.ld,(longlong *)local_2118.la);
  iVar35 = (uint)local_25b8;
  goto LAB_0016173a;
LAB_00161d15:
  if (*local_25a0 == '\0') {
    uVar22 = 0;
  }
  else {
    uVar22 = 0;
    iVar35 = 0;
    do {
      lVar36 = (long)iVar35;
      while( true ) {
        iVar35 = iVar35 + 1;
        bVar4 = local_25a0[lVar36];
        if (((bVar4 != 0x2d) && (bVar4 != 0x2b)) ||
           ((cVar3 = local_25a0[lVar36 + 1], cVar3 != '-' && (cVar3 != '+')))) break;
        if (bVar4 == 0x2d) {
          local_25a0[lVar36 + 1] = (cVar3 != '-') * '\x02' + '+';
        }
        lVar36 = lVar36 + 1;
      }
      local_2588[uVar22] = bVar4;
      uVar22 = uVar22 + 1;
    } while (local_25a0[iVar35] != '\0');
    uVar22 = uVar22 & 0xffffffff;
  }
  local_24d0 = (int)local_24c8 + local_2530;
  local_2588[uVar22] = 0;
  local_25e8 = local_2588;
  pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             *)0x0;
LAB_00161dc4:
  local_25e0 = (char *)CONCAT44(local_25e0._4_4_,local_25c0);
LAB_00161dcc:
  uVar22 = (ulong)local_25cc;
  while( true ) {
    pbVar26 = local_25e8;
    if ((local_25e8 == (byte *)0x0) || (bVar4 = *local_25e8, bVar4 == 0)) {
      local_25c0 = (int)local_25e0;
      goto LAB_001608a2;
    }
    uVar34 = (undefined7)(uVar22 >> 8);
    if ((uint)local_25b8 != 1) break;
    if (((byte)(bVar4 - 0x30) < 10) ||
       ((bVar4 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar4 & 0x3f) & 1) != 0)))) {
      local_2118.la[0] = 1;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_2518.ld,(longlong *)local_2118.la,(type *)0x0);
      if ((uVar22 & 1) == 0) {
LAB_00162099:
        LPFreadValue((Rational *)&local_2118.ld,(char **)&local_25e8,local_25c8->spxout,local_25bc);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2578.ld,
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2118.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2558.ld,
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_20f8.ld);
        if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
          operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
          operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
        }
        prVar18 = boost::
                  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_2578.ld,
                               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_2518.ld);
        iVar35 = 0;
        uVar22 = CONCAT71(uVar34,1);
      }
      else {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_23d8.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2578.ld);
        local_2118.la[0] = (limb_type)&local_24c0;
        local_2118.ld.data = (limb_pointer)&local_23d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2498.ld,
                   (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_2118.ld,(type *)0x0);
        local_24c0 = 1;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_2118.ld,&local_24c0,(type *)0x0);
        uVar30 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2498.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2118.ld);
        prVar18 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)CONCAT44(extraout_var_00,uVar30);
        pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)(ulong)uVar30;
        if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
          operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
          prVar18 = extraout_RAX;
        }
        if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
          operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
          prVar18 = extraout_RAX_00;
        }
        if ((local_2463 == '\0') && (local_2462 == '\0')) {
          operator_delete(local_2470,(ulong)local_2478 << 3);
          prVar18 = extraout_RAX_01;
        }
        if ((local_2483 == '\0') && (local_2482 == '\0')) {
          operator_delete(local_2498.ld.data,(local_2498.la[0] & 0xffffffff) << 3);
          prVar18 = extraout_RAX_02;
        }
        if ((local_23a3 == '\0') && (local_23a2 == '\0')) {
          operator_delete(local_23b0,(ulong)local_23b8 << 3);
          prVar18 = extraout_RAX_03;
        }
        if ((local_23c3 == '\0') && (local_23c2 == '\0')) {
          operator_delete(local_23d8.ld.data,(ulong)local_23d8.ld.capacity << 3);
          prVar18 = extraout_RAX_04;
        }
        iVar35 = 6;
        if (uVar30 == 0) {
          local_2498.la[0] = 0xffffffffffffffff;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_2118.ld,(longlong *)local_2498.la,(type *)0x0);
          uVar30 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2578.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2118.ld);
          pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(ulong)uVar30;
          if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
            operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
          }
          if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
            operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
          }
          if (uVar30 == 0) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2518.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2578.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_24f8.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2558.ld);
          }
          goto LAB_00162099;
        }
      }
      if ((local_24e3 == '\0') && (local_24e2 == '\0')) {
        operator_delete(local_24f8.ld.data,(ulong)local_24f8.ld.capacity << 3);
        prVar18 = extraout_RAX_05;
      }
      if ((local_2503 == '\0') && (local_2502 == '\0')) {
        operator_delete(local_2518.ld.data,(local_2518.la[0] & 0xffffffff) << 3);
        prVar18 = extraout_RAX_06;
      }
      if (iVar35 != 0) goto LAB_00163ae7;
    }
    bVar4 = *local_25e8;
    if (bVar4 != 0) {
      if (((uVar22 & 1) == 0) ||
         ((0x19 < (byte)((bVar4 & 0xdf) + 0xbf) &&
          (pvVar16 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar4,0x15), pvVar16 == (void *)0x0)
          ))) goto LAB_00163885;
      iVar35 = LPFreadColName((char **)&local_25e8,local_25b0,&local_2390,&local_118,
                              local_25c8->spxout);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::add(&local_24b8,iVar35,
            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)&local_2578.ld);
      local_25cc = 0;
      local_25c0 = (int)local_25e0;
      goto LAB_00163825;
    }
  }
  if (5 < (uint)local_25b8) {
switchD_001621e7_caseD_1:
    puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_2118.la[0] = (limb_type)&local_2108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2118,"XLPFRD01 This should never happen.","");
    *puVar20 = &PTR__SPxException_006a9ee8;
    puVar20[1] = puVar20 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar20 + 1),local_2118.la[0],(long)local_2118.ld.data + local_2118.la[0])
    ;
    *puVar20 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  switch((ulong)local_25b8 & 0xffffffff) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ELPFRD13 This seems to be no LP format file",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    goto LAB_00163885;
  case 1:
    goto switchD_001621e7_caseD_1;
  case 2:
    if (((byte)(bVar4 - 0x30) < 10) ||
       ((bVar4 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar4 & 0x3f) & 1) != 0)))) {
      local_2118.la[0] = 1;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_2518.ld,(longlong *)local_2118.la,(type *)0x0);
      if ((local_25cc & 1) == 0) {
LAB_00162980:
        LPFreadValue((Rational *)&local_2118.ld,(char **)&local_25e8,local_25c8->spxout,local_25bc);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2578.ld,
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2118.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2558.ld,
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_20f8.ld);
        if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
          operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
          operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
        }
        prVar18 = boost::
                  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_2578.ld,
                               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_2518.ld);
        if (local_25c0 == 0) {
          prVar18 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)CONCAT71((int7)((ulong)prVar18 >> 8),1);
          local_25cc = (uint)prVar18;
          iVar35 = 0;
        }
        else {
          if (local_25c0 == 0x3e) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2578.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.left.m_backend.m_value.den,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2558.ld);
            ::soplex::infinity::__tls_init();
            local_2118.la[0] = 0;
            local_2108 = 1;
            local_2104 = 0x100;
            local_2102 = '\0';
            local_20f8.la[0] = 1;
            local_20e8 = 1;
            local_20e4 = 0x100;
            local_20e2 = '\0';
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                         *)&local_2118.ld,local_2440);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.right,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2118.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.right.m_backend.m_value.den,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_20f8.ld);
            if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
              operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
            }
            if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
              operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
            }
          }
          else {
            if (local_25c0 == 0x3c) {
              ::soplex::infinity::__tls_init();
              local_2118.la[0] = 0;
              local_2108 = 1;
              local_2104 = 0x100;
              local_2102 = '\0';
              local_20f8.la[0] = 1;
              local_20e8 = 1;
              local_20e4 = 0x100;
              local_20e2 = '\0';
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
              ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                           *)&local_2118.ld,local_2434);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2118.ld);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8.left.m_backend.m_value.den,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_20f8.ld);
              if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
                operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
              }
              if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
                operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
              }
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8.right,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
            }
            else {
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8.left.m_backend.m_value.den,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2558.ld);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_22c8.right,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
            }
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_22c8.right.m_backend.m_value.den,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2558.ld);
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=(&local_22c8.vec,&local_24b8);
          local_2118.la[0] = 0xffffffff00000000;
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add(&local_21e0,(DataKey *)&local_2118.ld,&local_22c8);
          local_24b8.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ._8_8_ = local_24b8.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ._8_8_ & 0xffffffff;
          pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)CONCAT71((int7)((ulong)pcVar39 >> 8),1);
          if ((local_2594 & 1) != 0) {
            spxSnprintf((char *)local_2118.la,0x10,"C%d",
                        (ulong)(uint)local_21e0.
                                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     .set.thenum);
            NameSet::add(local_2528,(char *)local_2118.la);
            pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)(ulong)local_2594;
          }
          local_2118.la[0] = 1;
          prVar17 = boost::
                    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                    ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                                 *)&local_2578.ld,(longlong *)local_2118.la);
          local_25e8 = (byte *)0x0;
          iVar35 = 0x14;
          local_25cc = (uint)CONCAT71((int7)((ulong)prVar17 >> 8),1);
          local_25c0 = 0;
          prVar18 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)((ulong)pcVar39 & 0xffffffff);
          local_2594 = (uint)pcVar39;
        }
      }
      else {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2418.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2578.ld);
        local_2118.la[0] = (limb_type)&local_24c0;
        local_2118.ld.data = (limb_pointer)&local_2418;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2498.ld,
                   (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_2118.ld,(type *)0x0);
        local_24c0 = 1;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_2118.ld,&local_24c0,(type *)0x0);
        uVar30 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2498.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2118.ld);
        prVar18 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)CONCAT44(extraout_var_01,uVar30);
        pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)(ulong)uVar30;
        if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
          operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
          prVar18 = extraout_RAX_07;
        }
        if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
          operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
          prVar18 = extraout_RAX_08;
        }
        if ((local_2463 == '\0') && (local_2462 == '\0')) {
          operator_delete(local_2470,(ulong)local_2478 << 3);
          prVar18 = extraout_RAX_09;
        }
        if ((local_2483 == '\0') && (local_2482 == '\0')) {
          operator_delete(local_2498.ld.data,(local_2498.la[0] & 0xffffffff) << 3);
          prVar18 = extraout_RAX_10;
        }
        if ((local_23e3 == '\0') && (local_23e2 == '\0')) {
          operator_delete(local_23f0,(ulong)local_23f8 << 3);
          prVar18 = extraout_RAX_11;
        }
        if ((local_2403 == '\0') && (local_2402 == '\0')) {
          operator_delete(local_2418.ld.data,(ulong)local_2418.ld.capacity << 3);
          prVar18 = extraout_RAX_12;
        }
        iVar35 = 6;
        if (uVar30 == 0) {
          local_2498.la[0] = 0xffffffffffffffff;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_2118.ld,(longlong *)local_2498.la,(type *)0x0);
          uVar30 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2578.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2118.ld);
          pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(ulong)uVar30;
          if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
            operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
          }
          if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
            operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
          }
          if (uVar30 == 0) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2518.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2578.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_24f8.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2558.ld);
          }
          goto LAB_00162980;
        }
      }
      if ((local_24e3 == '\0') && (local_24e2 == '\0')) {
        operator_delete(local_24f8.ld.data,(ulong)local_24f8.ld.capacity << 3);
        prVar18 = extraout_RAX_13;
      }
      if ((local_2503 == '\0') && (local_2502 == '\0')) {
        operator_delete(local_2518.ld.data,(local_2518.la[0] & 0xffffffff) << 3);
        prVar18 = extraout_RAX_14;
      }
      if (iVar35 != 0) {
        if (iVar35 == 0x14) goto LAB_00161dc4;
LAB_00163ae7:
        if (iVar35 != 6) goto LAB_00163a35;
        goto LAB_00163885;
      }
    }
    bVar4 = *local_25e8;
    if (bVar4 == 0) goto LAB_00161dc4;
    if ((local_25cc & 1) == 0) goto LAB_001633ee;
    if ((0x19 < (byte)((bVar4 & 0xdf) + 0xbf)) &&
       (pvVar16 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar4,0x15), pvVar16 == (void *)0x0)) {
      local_2518.la[0] = 1;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_2118.ld,(longlong *)local_2518.la,(type *)0x0);
      uVar30 = boost::multiprecision::backends::
               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_2578.ld,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_2118.ld);
      pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(ulong)uVar30;
      if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
        operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
      }
      if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
        operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
      }
      if ((uVar30 != 0) || (2 < (byte)(*local_25e8 - 0x3c))) goto LAB_00163885;
      goto LAB_001633e6;
    }
    uVar30 = LPFreadColName((char **)&local_25e8,local_25b0,&local_2390,&local_118,
                            local_25c8->spxout);
    pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(ulong)uVar30;
    local_2518.la[0] = 0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)&local_2118.ld,(longlong *)local_2518.la,(type *)0x0);
    iVar35 = boost::multiprecision::backends::
             rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
             ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_2578.ld,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_2118.ld);
    if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
      operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
    }
    if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
      operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
    }
    if (iVar35 == 0) goto LAB_001633e6;
    if (local_24b8.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .m_elem ==
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)0x0) goto LAB_001631f7;
    uVar22 = (ulong)local_24b8.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .memused;
    if ((long)uVar22 < 1) goto LAB_001631f7;
    if ((local_24b8.
         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .m_elem)->idx != uVar30) {
      uVar33 = 0;
      piVar23 = &local_24b8.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .m_elem[1].idx;
      goto LAB_001631d9;
    }
    bVar8 = true;
    uVar33 = 0;
    goto LAB_001631f3;
  case 3:
    break;
  default:
    iVar35 = LPFreadColName((char **)&local_25e8,local_25b0,&local_2390,
                            (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                             *)0x0,local_25c8->spxout);
    pnVar7 = local_2390.low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar35 < 0) {
      pSVar19 = local_25c8->spxout;
      if ((pSVar19 != (SPxOut *)0x0) && (0 < (int)pSVar19->m_verbosity)) {
        local_2118.ld.capacity = pSVar19->m_verbosity;
        local_2518.ld.capacity = 1;
        (*pSVar19->_vptr_SPxOut[2])(pSVar19,&local_2518);
        pSVar19 = local_25c8->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar19->m_streams[pSVar19->m_verbosity],
                   "WLPFRD12 in Binary/General section line ",0x28);
        std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],local_25bc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar19->m_streams[pSVar19->m_verbosity]," ignored",8);
        pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)pSVar19->m_streams[pSVar19->m_verbosity];
        std::ios::widen((char)*(undefined8 *)((pcVar39->m_data).la[0] - 0x18) + (char)pcVar39);
        std::ostream::put((char)pcVar39);
        std::ostream::flush();
        (*local_25c8->spxout->_vptr_SPxOut[2])(local_25c8->spxout,&local_2118);
      }
    }
    else {
      if ((uint)local_25b8 == 5) {
        local_25e0 = (char *)CONCAT44(local_25e0._4_4_,iVar35);
        local_2518.la[0] = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_2118.ld,(longlong *)local_2518.la,(type *)0x0);
        uVar22 = (ulong)local_25e0 & 0xffffffff;
        pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)(uVar22 * 0x40);
        iVar35 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare(&pnVar7[uVar22].m_backend,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2118.ld);
        if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
          operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
          operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
        }
        if (iVar35 < 0) {
          local_2118.la[0] = 0;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                       *)(local_2390.low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar22),
                      (longlong *)local_2118.la);
        }
        pnVar7 = local_2390.up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_2518.la[0] = 1;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_2118.ld,(longlong *)local_2518.la,(type *)0x0);
        iVar28 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare(&pnVar7[uVar22].m_backend,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_2118.ld);
        iVar35 = (int)local_25e0;
        if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
          operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
          operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
        }
        if (0 < iVar28) {
          pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)((long)&pcVar39->m_data +
                       (long)local_2390.up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          local_2118.la[0] = 1;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                       *)pcVar39,(longlong *)local_2118.la);
        }
      }
      if (local_2520 != (DIdxSet *)0x0) {
        DIdxSet::addIdx(local_2520,iVar35);
      }
    }
    goto LAB_00163825;
  }
  uVar22 = CONCAT71(uVar34,1);
  if (9 < (byte)(bVar4 - 0x30)) {
    if (bVar4 < 0x2f) {
      uVar22 = 0x680000000000 >> (bVar4 & 0x3f);
    }
    else {
      uVar22 = 0;
    }
  }
  local_25e0 = (char *)((ulong)local_25e0 & 0xffffffff00000000);
  if ((uVar22 & 1) != 0) {
    if ((((*local_25e8 == 0x2d) || (*local_25e8 == 0x2b)) &&
        (iVar35 = tolower((int)(char)local_25e8[1]), iVar35 == 0x69)) &&
       ((iVar35 = tolower((int)(char)pbVar26[2]), iVar35 == 0x6e &&
        (iVar35 = tolower((int)(char)pbVar26[3]), iVar35 == 0x66)))) {
      LPFreadInfinity((Rational *)&local_2118.ld,(char **)&local_25e8);
    }
    else {
      LPFreadValue((Rational *)&local_2118.ld,(char **)&local_25e8,local_25c8->spxout,local_25bc);
    }
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_2578.ld,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_2118.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_2558.ld,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_20f8.ld);
    if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
      operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
    }
    if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
      operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
    }
    if (2 < (byte)(*local_25e8 - 0x3c)) goto LAB_00163885;
    bVar4 = local_25e8[1];
    if (bVar4 == 0x3e) {
LAB_0016233f:
      bVar9 = local_25e8[1];
      pbVar32 = local_25e8 + 2;
    }
    else {
      bVar9 = *local_25e8;
      if (bVar4 == 0x3d) {
        pbVar32 = local_25e8 + 2;
      }
      else {
        pbVar32 = local_25e8 + 1;
        if (bVar4 == 0x3c) goto LAB_0016233f;
      }
    }
    local_25e8 = pbVar32;
    if (((ulong)*local_25e8 < 0x21) && ((0x100002600U >> ((ulong)*local_25e8 & 0x3f) & 1) != 0)) {
      local_25e8 = local_25e8 + 1;
    }
    local_25e0 = (char *)CONCAT44(local_25e0._4_4_,(int)(char)bVar9);
  }
  bVar4 = *local_25e8;
  if ((bVar4 == 0) ||
     ((0x19 < (byte)((bVar4 & 0xdf) + 0xbf) &&
      (pvVar16 = memchr("!\"#$%&()/,;?@_\'`{}|~",(int)(char)bVar4,0x15), pvVar16 == (void *)0x0))))
  goto LAB_00163885;
  uVar30 = LPFreadColName((char **)&local_25e8,local_25b0,&local_2390,
                          (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)0x0,local_25c8->spxout);
  pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             *)(ulong)uVar30;
  if (-1 < (int)uVar30) goto LAB_00163186;
  pSVar19 = local_25c8->spxout;
  if ((pSVar19 != (SPxOut *)0x0) && (0 < (int)pSVar19->m_verbosity)) {
    local_2118.ld.capacity = pSVar19->m_verbosity;
    local_2518.ld.capacity = 1;
    (*pSVar19->_vptr_SPxOut[2])(pSVar19,&local_2518);
    pSVar19 = local_25c8->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar19->m_streams[pSVar19->m_verbosity],"WLPFRD11 in Bounds section line ",0x20);
    std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],local_25bc);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar19->m_streams[pSVar19->m_verbosity]," ignored",8);
    pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)pSVar19->m_streams[pSVar19->m_verbosity];
    std::ios::widen((char)*(undefined8 *)((pcVar39->m_data).la[0] - 0x18) + (char)pcVar39);
    std::ostream::put((char)pcVar39);
    std::ostream::flush();
    (*local_25c8->spxout->_vptr_SPxOut[2])(local_25c8->spxout,&local_2118);
  }
  *local_25e8 = 0;
  goto LAB_00161dcc;
LAB_00163186:
  if ((int)local_25e0 != 0) {
    if ((int)local_25e0 == 0x3e) {
      pcVar27 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar27,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
    }
    else if ((int)local_25e0 == 0x3c) {
      pcVar27 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar27,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
    }
    else {
      pcVar27 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar27,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar27 + 1,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_2558.ld);
      pcVar27 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar27,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
    }
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar27 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_2558.ld);
  }
  pbVar32 = local_25e8;
  bVar4 = *local_25e8;
  iVar35 = tolower((int)(char)bVar4);
  if ((((iVar35 == 0x66) && (iVar35 = tolower((int)(char)pbVar32[1]), iVar35 == 0x72)) &&
      (iVar35 = tolower((int)(char)pbVar32[2]), iVar35 == 0x65)) &&
     (iVar35 = tolower((int)(char)pbVar32[3]), iVar35 == 0x65)) {
    ::soplex::infinity::__tls_init();
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39),local_2434);
    ::soplex::infinity::__tls_init();
    pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(local_2390.up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)pcVar39,local_2440);
    local_25e8 = local_25e8 + 4;
    p_input = local_24d8;
  }
  else {
    p_input = local_24d8;
    if (2 < (byte)(bVar4 - 0x3c)) goto LAB_00163817;
    local_25e8 = pbVar32 + 1;
    bVar4 = pbVar32[1];
    if (bVar4 == 0x3e) {
LAB_001635c0:
      local_25e8 = pbVar32 + 2;
      bVar9 = bVar4;
    }
    else {
      bVar9 = *pbVar32;
      if (bVar4 == 0x3d) {
        local_25e8 = pbVar32 + 2;
      }
      else if (bVar4 == 0x3c) goto LAB_001635c0;
    }
    if (((ulong)*local_25e8 < 0x21) && ((0x100002600U >> ((ulong)*local_25e8 & 0x3f) & 1) != 0)) {
      local_25e8 = local_25e8 + 1;
    }
    pbVar32 = local_25e8;
    bVar4 = *local_25e8;
    if ((9 < (byte)(bVar4 - 0x30)) &&
       ((0x2e < bVar4 || ((0x680000000000U >> ((ulong)(uint)bVar4 & 0x3f) & 1) == 0))))
    goto LAB_00163885;
    if (((*local_25e8 == 0x2d) || (*local_25e8 == 0x2b)) &&
       (((iVar35 = tolower((int)(char)local_25e8[1]), iVar35 == 0x69 &&
         (iVar35 = tolower((int)(char)pbVar32[2]), iVar35 == 0x6e)) &&
        (iVar35 = tolower((int)(char)pbVar32[3]), iVar35 == 0x66)))) {
      LPFreadInfinity((Rational *)&local_2118.ld,(char **)&local_25e8);
    }
    else {
      LPFreadValue((Rational *)&local_2118.ld,(char **)&local_25e8,local_25c8->spxout,local_25bc);
    }
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_2578.ld,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_2118.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_2558.ld,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_20f8.ld);
    if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
      operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
    }
    if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
      operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
    }
    if (bVar9 == 0x3e) {
      pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
      pcVar39 = pcVar39 + 1;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2558.ld);
      uVar22 = 1;
      local_25e0 = (char *)CONCAT44(local_25e0._4_4_,0x3e);
      goto LAB_00163817;
    }
    if (bVar9 == 0x3c) {
      pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)(local_2390.up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
      pcVar39 = pcVar39 + 1;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2558.ld);
      uVar22 = 1;
      local_25e0 = (char *)CONCAT44(local_25e0._4_4_,0x3c);
      goto LAB_00163817;
    }
    pcVar27 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(local_2390.low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar27,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2578.ld);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar27 + 1,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_2558.ld);
    pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)(local_2390.up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pcVar39);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2578.ld);
    pcVar39 = pcVar39 + 1;
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2558.ld);
    local_25e0 = (char *)CONCAT44(local_25e0._4_4_,(int)(char)bVar9);
  }
  uVar22 = 1;
LAB_00163817:
  local_25c0 = (int)local_25e0;
  if ((uVar22 & 1) == 0) goto LAB_00163885;
  goto LAB_00163825;
  while( true ) {
    uVar33 = uVar33 + 1;
    uVar38 = *piVar23;
    piVar23 = piVar23 + 0x14;
    if (uVar38 == uVar30) break;
LAB_001631d9:
    if (uVar22 - 1 == uVar33) goto LAB_001631f7;
  }
  bVar8 = uVar33 < uVar22;
LAB_001631f3:
  uVar38 = (uint)uVar33;
  if (!bVar8) {
LAB_001631f7:
    uVar38 = 0xffffffff;
  }
  if ((int)uVar38 < 0) {
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::add(&local_24b8,uVar30,
          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
           *)&local_2578.ld);
  }
  else {
    local_25e0 = (char *)CONCAT44(local_25e0._4_4_,uVar30);
    pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)((ulong)uVar38 * 0x50);
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator+=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&local_2578.ld,
                 (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)(local_24b8.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     .m_elem + uVar38));
    local_2518.la[0] = 0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)&local_2118.ld,(longlong *)local_2518.la,(type *)0x0);
    iVar35 = boost::multiprecision::backends::
             rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
             ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_2578.ld,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_2118.ld);
    if ((local_20e4._1_1_ == '\0') && (local_20e2 == '\0')) {
      operator_delete(local_20f8.ld.data,(local_20f8.la[0] & 0xffffffff) << 3);
    }
    if ((local_2104._1_1_ == '\0') && (local_2102 == '\0')) {
      operator_delete(local_2118.ld.data,(local_2118.la[0] & 0xffffffff) << 3);
    }
    if (iVar35 == 0) {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::remove(&local_24b8.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ,(char *)(ulong)uVar38);
    }
    else {
      pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)((long)&pcVar39->m_data +
                   (long)local_24b8.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         .m_elem);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2578.ld);
      pcVar39 = pcVar39 + 1;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(pcVar39,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_2558.ld);
    }
    pSVar19 = local_25c8->spxout;
    if ((pSVar19 != (SPxOut *)0x0) && (0 < (int)pSVar19->m_verbosity)) {
      local_2118.ld.capacity = pSVar19->m_verbosity;
      local_2518.ld.capacity = 1;
      (*pSVar19->_vptr_SPxOut[2])(pSVar19,&local_2518);
      pSVar19 = soplex::operator<<(local_25c8->spxout,"WLPFRD10 Duplicate index ");
      pSVar19 = soplex::operator<<(pSVar19,local_25b0->mem +
                                           (local_25b0->set).theitem
                                           [(local_25b0->set).thekey[(int)local_25e0].idx].data);
      pcVar39 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)soplex::operator<<(pSVar19," in line ");
      std::ostream::operator<<
                (*(ostream **)
                  (*(long *)&pcVar39->m_limbs + (ulong)*(uint *)((long)&pcVar39->m_data + 8) * 8),
                 local_25bc);
      std::endl<char,std::char_traits<char>>
                (*(ostream **)
                  (*(long *)&pcVar39->m_limbs + (ulong)*(uint *)((long)&pcVar39->m_data + 8) * 8));
      (*local_25c8->spxout->_vptr_SPxOut[2])(local_25c8->spxout,&local_2118);
    }
  }
LAB_001633e6:
  local_25cc = 0;
LAB_001633ee:
  if (2 < (byte)(*local_25e8 - 0x3c)) goto LAB_00163825;
  bVar4 = local_25e8[1];
  if (bVar4 == 0x3e) {
LAB_0016341d:
    bVar9 = local_25e8[1];
    pbVar32 = local_25e8 + 2;
  }
  else {
    bVar9 = *local_25e8;
    if (bVar4 == 0x3d) {
      pbVar32 = local_25e8 + 2;
    }
    else {
      pbVar32 = local_25e8 + 1;
      if (bVar4 == 0x3c) goto LAB_0016341d;
    }
  }
  local_25e8 = pbVar32;
  if (((ulong)*local_25e8 < 0x21) && ((0x100002600U >> ((ulong)*local_25e8 & 0x3f) & 1) != 0)) {
    local_25e8 = local_25e8 + 1;
  }
  local_25c0 = (int)(char)bVar9;
LAB_00163825:
  if (local_25e8 == pbVar26) {
LAB_00163885:
    if (((ulong)local_2590 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ELPFRD15 Syntax error in line ",0x1e);
      plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_25bc);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      std::ostream::flush();
    }
    else {
      pSVar19 = local_25c8->spxout;
      if ((pSVar19 != (SPxOut *)0x0) && (3 < (int)pSVar19->m_verbosity)) {
        local_2118.ld.capacity = pSVar19->m_verbosity;
        local_2518.ld.capacity = 4;
        (*pSVar19->_vptr_SPxOut[2])();
        pSVar19 = local_25c8->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar19->m_streams[pSVar19->m_verbosity],"Finished reading ",0x11);
        std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],local_25bc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar19->m_streams[pSVar19->m_verbosity]," lines",6);
        cVar3 = (char)pSVar19->m_streams[pSVar19->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar19->m_streams[pSVar19->m_verbosity] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        (*local_25c8->spxout->_vptr_SPxOut[2])(local_25c8->spxout,&local_2118);
      }
    }
    if (local_2450 == (NameSet *)0x0) {
      free(local_25b0);
      local_25b0 = (NameSet *)0x0;
    }
    if (local_2448 == (NameSet *)0x0) {
      free(local_2528);
      local_2528 = (NameSet *)0x0;
    }
    free(local_2580);
    local_2580 = (byte *)0x0;
    free(local_25a0);
    local_25a0 = (char *)0x0;
    free(local_2588);
    local_2588 = (byte *)0x0;
    prVar18 = local_2590;
LAB_00163a35:
    local_2590 = prVar18;
    if ((local_2543 == '\0') && (local_2542 == '\0')) {
      operator_delete(local_2558.ld.data,(ulong)local_2558.ld.capacity << 3);
    }
    if ((local_2563 == '\0') && (local_2562 == '\0')) {
      operator_delete(local_2578.ld.data,(ulong)local_2578.ld.capacity << 3);
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~DSVectorBase(&local_24b8);
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPRowBase(&local_22c8);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPColBase(&local_118);
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPRowSetBase(&local_21e0);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPColSetBase(&local_2390);
    return (bool)((byte)local_2590 & 1);
  }
  goto LAB_00161dc4;
}

Assistant:

inline
bool SPxLPBase<Rational>::readLPF(
   std::istream& p_input,                ///< input stream.
   NameSet*      p_rnames,               ///< row names.
   NameSet*      p_cnames,               ///< column names.
   DIdxSet*      p_intvars)              ///< integer variables.
{
   enum
   {
      START, OBJECTIVE, CONSTRAINTS, BOUNDS, INTEGERS, BINARIES
   } section = START;

   NameSet* rnames;                      ///< row names.
   NameSet* cnames;                      ///< column names.

   LPColSetBase<Rational> cset;              ///< the set of columns read.
   LPRowSetBase<Rational> rset;              ///< the set of rows read.
   LPColBase<Rational> emptycol;             ///< reusable empty column.
   LPRowBase<Rational> row;                  ///< last assembled row.
   DSVectorBase<Rational> vec;               ///< last assembled vector (from row).

   Rational val = 1;
   int colidx;
   int sense = 0;

   int lineno = 0;
   bool unnamed = true;
   bool finished = false;
   bool other;
   bool have_value = true;
   int i;
   int k;
   int buf_size;
   int buf_pos;
   char* buf = nullptr;
   char* tmp = nullptr;
   char* line = nullptr;
   char* s = nullptr;
   char* pos = nullptr;
   char* pos_old = nullptr;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<Rational>::clear(); // clear the LP.

   //--------------------------------------------------------------------------
   //--- Main Loop
   //--------------------------------------------------------------------------
   buf_size = SOPLEX_LPF_MAX_LINE_LEN;
   spx_alloc(buf, buf_size);
   spx_alloc(tmp, buf_size);
   spx_alloc(line, buf_size);

   for(;;)
   {
      buf_pos = 0;

      while(!p_input.getline(buf + buf_pos, buf_size - buf_pos))
      {
         p_input.clear();

         if(strlen(buf) == (size_t) buf_size - 1)
         {
            buf_pos = buf_size - 1;
            buf_size = buf_size + SOPLEX_LPF_MAX_LINE_LEN;

            if(buf_size >= INT_MAX)
            {
               SPX_MSG_ERROR(std::cerr << "ELPFRD16 Line longer than INT_MAX" << std::endl;)
               goto syntax_error;
            }

            spx_realloc(buf, buf_size);
         }
         else
         {
            SPX_MSG_ERROR(std::cerr << "ELPFRD07 No 'End' marker found" << std::endl;)
            finished = true;
            break;
         }
      }

      if(finished)
         break;

      if((size_t) buf_size > sizeof(tmp))
      {
         spx_realloc(tmp, buf_size);
         spx_realloc(line, buf_size);
      }

      lineno++;
      i   = 0;
      pos = buf;

      SPxOut::debug(spxout, "DLPFRD08 Reading line {} (pos={})\n", lineno, pos);

      // 1. Remove comments.
      if(nullptr != (s = strchr(buf, '\\')))
         * s = '\0';

      // 2. Look for keywords.
      if(section == START)
      {
         if(LPFhasKeyword(pos, "max[imize]"))
         {
            changeSense(SPxLPBase<Rational>::MAXIMIZE);
            section = OBJECTIVE;
         }
         else if(LPFhasKeyword(pos, "min[imize]"))
         {
            changeSense(SPxLPBase<Rational>::MINIMIZE);
            section = OBJECTIVE;
         }
      }
      else if(section == OBJECTIVE)
      {
         if(LPFhasKeyword(pos, "s[ubject][   ]t[o]")
               || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
               || LPFhasKeyword(pos, "s[.][    ]t[.]")
               || LPFhasKeyword(pos, "lazy con[straints]"))
         {
            // store objective vector
            for(int j = vec.size() - 1; j >= 0; --j)
               cset.maxObj_w(vec.index(j)) = vec.value(j);

            // multiplication with -1 for minimization is done below
            vec.clear();
            have_value = true;
            val = 1;
            section = CONSTRAINTS;
         }
      }
      else if(section == CONSTRAINTS &&
              (LPFhasKeyword(pos, "s[ubject][   ]t[o]")
               || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
               || LPFhasKeyword(pos, "s[.][    ]t[.]")))
      {
         have_value = true;
         val = 1;
      }
      else
      {
         if(LPFhasKeyword(pos, "lazy con[straints]"))
            ;
         else if(LPFhasKeyword(pos, "bound[s]"))
            section = BOUNDS;
         else if(LPFhasKeyword(pos, "bin[ary]"))
            section = BINARIES;
         else if(LPFhasKeyword(pos, "bin[aries]"))
            section = BINARIES;
         else if(LPFhasKeyword(pos, "gen[erals]"))
            section = INTEGERS;
         else if(LPFhasKeyword(pos, "int[egers]"))   // this is undocumented
            section = INTEGERS;
         else if(LPFhasKeyword(pos, "end"))
         {
            finished = true;
            break;
         }
         else if(LPFhasKeyword(pos, "s[ubject][   ]t[o]")  // second time
                 || LPFhasKeyword(pos, "s[uch][    ]t[hat]")
                 || LPFhasKeyword(pos, "s[.][    ]t[.]")
                 || LPFhasKeyword(pos, "lazy con[straints]"))
         {
            // In principle this has to checked for all keywords above,
            // otherwise we just ignore any half finished constraint
            if(have_value)
               goto syntax_error;

            have_value = true;
            val = 1;
         }
      }

      // 3a. Look for row names in objective and drop it.
      if(section == OBJECTIVE)
         LPFhasRowName(pos, nullptr);

      // 3b. Look for row name in constraint and store it.
      if(section == CONSTRAINTS)
         if(LPFhasRowName(pos, rnames))
            unnamed = false;

      // 4a. Remove initial spaces.
      while(LPFisSpace(pos[i]))
         i++;

      // 4b. remove spaces if they do not appear before the name of a vaiable.
      for(k = 0; pos[i] != '\0'; i++)
         if(!LPFisSpace(pos[i]) || LPFisColName(&pos[i + 1]))
            tmp[k++] = pos[i];

      tmp[k] = '\0';

      // 5. Is this an empty line ?
      if(tmp[0] == '\0')
         continue;

      // 6. Collapse sequences of '+' and '-'. e.g ++---+ => -
      for(i = 0, k = 0; tmp[i] != '\0'; i++)
      {
         while(((tmp[i] == '+') || (tmp[i] == '-')) && ((tmp[i + 1] == '+') || (tmp[i + 1] == '-')))
         {
            if(tmp[i++] == '-')
               tmp[i] = (tmp[i] == '-') ? '+' : '-';
         }

         line[k++] = tmp[i];
      }

      line[k] = '\0';

      //-----------------------------------------------------------------------
      //--- Line processing loop
      //-----------------------------------------------------------------------
      pos = line;

      SPxOut::debug(spxout, "DLPFRD09 pos= {}\n", pos);

      // 7. We have something left to process.
      while((pos != nullptr) && (*pos != '\0'))
      {
         // remember our position, so we are sure we make progress.
         pos_old = pos;

         // now process the sections
         switch(section)
         {
         case OBJECTIVE:
            if(LPFisValue(pos))
            {
               Rational pre_sign = 1;

               /* Already having here a value could only result from being the first number in a constraint, or a sign
                * '+' or '-' as last token on the previous line.
                */
               if(have_value)
               {
                  if(spxAbs(val) != 1)
                     goto syntax_error;

                  if(val == -1)
                     pre_sign = val;
               }

               have_value = true;
               val = LPFreadValue(pos, spxout, lineno);
               val *= pre_sign;
            }

            if(*pos == '\0')
               continue;

            if(!have_value || !LPFisColName(pos))
               goto syntax_error;

            have_value = false;
            colidx = LPFreadColName(pos, cnames, cset, &emptycol, spxout);
            vec.add(colidx, val);
            break;

         case CONSTRAINTS:
            if(LPFisValue(pos))
            {
               Rational pre_sign = 1;

               /* Already having here a value could only result from being the first number in a constraint, or a sign
                * '+' or '-' as last token on the previous line.
                */
               if(have_value)
               {
                  if(spxAbs(val) != 1)
                     goto syntax_error;

                  if(val == -1)
                     pre_sign = val;
               }

               have_value = true;
               val = LPFreadValue(pos, spxout, lineno);
               val *= pre_sign;

               if(sense != 0)
               {
                  if(sense == '<')
                  {
                     row.setLhs(-infinity);
                     row.setRhs(val);
                  }
                  else if(sense == '>')
                  {
                     row.setLhs(val);
                     row.setRhs(infinity);
                  }
                  else
                  {
                     assert(sense == '=');

                     row.setLhs(val);
                     row.setRhs(val);
                  }

                  row.setRowVector(vec);
                  rset.add(row);
                  vec.clear();

                  if(!unnamed)
                     unnamed = true;
                  else
                  {
                     char name[16];
                     spxSnprintf(name, 16, "C%d", rset.num());
                     rnames->add(name);
                  }

                  have_value = true;
                  val = 1;
                  sense = 0;
                  pos = nullptr;
                  // next line
                  continue;
               }
            }

            if(*pos == '\0')
               continue;

            if(have_value)
            {
               if(LPFisColName(pos))
               {
                  colidx = LPFreadColName(pos, cnames, cset, &emptycol, spxout);

                  if(val != 0)
                  {
                     // Do we have this index already in the row?
                     int n = vec.pos(colidx);

                     // if not, add it
                     if(n < 0)
                        vec.add(colidx, val);
                     // if yes, add them up and remove the element if it amounts to zero
                     else
                     {
                        assert(vec.index(n) == colidx);

                        val += vec.value(n);

                        if(val == 0)
                           vec.remove(n);
                        else
                           vec.value(n) = val;

                        assert(cnames->has(colidx));

                        SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WLPFRD10 Duplicate index "
                                        << (*cnames)[colidx]
                                        << " in line " << lineno
                                        << std::endl;)
                     }
                  }

                  have_value = false;
               }
               else
               {
                  // We have a row like c1: <= 5 with no variables. We can not handle 10 <= 5; issue a syntax error.
                  if(val != 1)
                     goto syntax_error;

                  // If the next thing is not the sense we give up also.
                  if(!LPFisSense(pos))
                     goto syntax_error;

                  have_value = false;
               }
            }

            assert(!have_value);

            if(LPFisSense(pos))
               sense = LPFreadSense(pos);

            break;

         case BOUNDS:
            other = false;
            sense = 0;

            if(LPFisValue(pos))
            {
               val = LPFisInfinity(pos) ? LPFreadInfinity(pos) : LPFreadValue(pos, spxout, lineno);

               if(!LPFisSense(pos))
                  goto syntax_error;

               sense = LPFreadSense(pos);
               other = true;
            }

            if(!LPFisColName(pos))
               goto syntax_error;

            if((colidx = LPFreadColName(pos, cnames, cset, nullptr, spxout)) < 0)
            {
               SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WLPFRD11 in Bounds section line "
                               << lineno << " ignored" << std::endl;)
               *pos = '\0';
               continue;
            }

            if(sense)
            {
               if(sense == '<')
                  cset.lower_w(colidx) = val;
               else if(sense == '>')
                  cset.upper_w(colidx) = val;
               else
               {
                  assert(sense == '=');
                  cset.lower_w(colidx) = val;
                  cset.upper_w(colidx) = val;
               }
            }

            if(LPFisFree(pos))
            {
               cset.lower_w(colidx) = -infinity;
               cset.upper_w(colidx) =  infinity;
               other = true;
               pos += 4;  // set position after the word "free"
            }
            else if(LPFisSense(pos))
            {
               sense = LPFreadSense(pos);
               other = true;

               if(!LPFisValue(pos))
                  goto syntax_error;

               val = LPFisInfinity(pos) ? LPFreadInfinity(pos) : LPFreadValue(pos,  spxout, lineno);

               if(sense == '<')
                  cset.upper_w(colidx) = val;
               else if(sense == '>')
                  cset.lower_w(colidx) = val;
               else
               {
                  assert(sense == '=');
                  cset.lower_w(colidx) = val;
                  cset.upper_w(colidx) = val;
               }
            }

            /* Do we have only a single column name in the input line?  We could ignore this savely, but it is probably
             * a sign of some other error.
             */
            if(!other)
               goto syntax_error;

            break;

         case BINARIES:
         case INTEGERS:
            if((colidx = LPFreadColName(pos, cnames, cset, nullptr, spxout)) < 0)
            {
               SPX_MSG_WARNING((*this->spxout),
                               (*this->spxout) << "WLPFRD12 in Binary/General section line " << lineno
                               << " ignored" << std::endl;)
            }
            else
            {
               if(section == BINARIES)
               {
                  if(cset.lower(colidx) < 0)
                  {
                     cset.lower_w(colidx) = 0;
                  }

                  if(cset.upper(colidx) > 1)
                  {
                     cset.upper_w(colidx) = 1;
                  }
               }

               if(p_intvars != nullptr)
                  p_intvars->addIdx(colidx);
            }

            break;

         case START:
            SPX_MSG_ERROR(std::cerr << "ELPFRD13 This seems to be no LP format file" << std::endl;)
            goto syntax_error;

         default:
            throw SPxInternalCodeException("XLPFRD01 This should never happen.");
         }

         if(pos == pos_old)
            goto syntax_error;
      }
   }

   assert(isConsistent());

   addCols(cset);
   assert(isConsistent());

   addRows(rset);
   assert(isConsistent());

syntax_error:

   if(finished)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Finished reading " << lineno << " lines" <<
                    std::endl;)
   }
   else
      SPX_MSG_ERROR(std::cerr << "ELPFRD15 Syntax error in line " << lineno << std::endl;)

      if(p_cnames == nullptr)
         spx_free(cnames);

   if(p_rnames == nullptr)
      spx_free(rnames);

   spx_free(buf);
   spx_free(tmp);
   spx_free(line);

   return finished;
}